

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QNetworkProxy *proxy)

{
  ProxyType t;
  long lVar1;
  QNetworkProxyPrivate *pQVar2;
  long *plVar3;
  QDebug *pQVar4;
  unsigned_short t_00;
  QNetworkProxy *in_RDX;
  Int IVar5;
  char *t_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<QString> local_58;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)proxy);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  pQVar2 = (in_RDX->d).d.ptr;
  if (pQVar2 == (QNetworkProxyPrivate *)0x0) {
switchD_001b0e2b_caseD_0:
    t_01 = "DefaultProxy ";
  }
  else {
    t = pQVar2->type;
    switch(t) {
    case DefaultProxy:
      goto switchD_001b0e2b_caseD_0;
    case Socks5Proxy:
      t_01 = "Socks5Proxy ";
      break;
    case NoProxy:
      t_01 = "NoProxy ";
      break;
    case HttpProxy:
      t_01 = "HttpProxy ";
      break;
    case HttpCachingProxy:
      t_01 = "HttpCachingProxy ";
      break;
    case FtpCachingProxy:
      t_01 = "FtpCachingProxy ";
      break;
    default:
      pQVar4 = QDebug::operator<<((QDebug *)proxy,"Unknown proxy ");
      QDebug::operator<<(pQVar4,t);
      goto LAB_001b0e3d;
    }
  }
  QDebug::operator<<((QDebug *)proxy,t_01);
LAB_001b0e3d:
  pQVar4 = QDebug::operator<<((QDebug *)proxy,'\"');
  QNetworkProxy::hostName((QString *)&local_58,in_RDX);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_58);
  pQVar4 = QDebug::operator<<(pQVar4,':');
  pQVar2 = (in_RDX->d).d.ptr;
  if (pQVar2 == (QNetworkProxyPrivate *)0x0) {
    t_00 = 0;
  }
  else {
    t_00 = pQVar2->port;
  }
  pQVar4 = QDebug::operator<<(pQVar4,t_00);
  QDebug::operator<<(pQVar4,"\" ");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  pQVar2 = (in_RDX->d).d.ptr;
  if (pQVar2 == (QNetworkProxyPrivate *)0x0) {
    IVar5 = 0x67;
  }
  else {
    IVar5 = (pQVar2->capabilities).super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
            super_QFlagsStorage<QNetworkProxy::Capability>.i;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  if ((IVar5 & 1) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"Tunnel";
    local_88.size = 0;
    local_70.size = 6;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 2) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"Listen";
    local_88.size = 0;
    local_70.size = 6;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 4) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"UDP";
    local_88.size = 0;
    local_70.size = 3;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 8) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"Caching";
    local_88.size = 0;
    local_70.size = 7;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 0x10) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"NameLookup";
    local_88.size = 0;
    local_70.size = 10;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 0x20) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"SctpTunnel";
    local_88.size = 0;
    local_70.size = 10;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  if ((IVar5 & 0x40) != 0) {
    local_70.d = (Data *)0x0;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_70.ptr = L"SctpListen";
    local_88.size = 0;
    local_70.size = 10;
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  pQVar4 = QDebug::operator<<((QDebug *)proxy,'[');
  QListSpecialMethods<QString>::join
            ((QString *)&local_70,(QListSpecialMethods<QString> *)&local_58,(QChar)0x20);
  pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_70);
  QDebug::operator<<(pQVar4,']');
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  pQVar2 = (proxy->d).d.ptr;
  (proxy->d).d.ptr = (QNetworkProxyPrivate *)0x0;
  *(QNetworkProxyPrivate **)debug.stream = pQVar2;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

QDebug operator<<(QDebug debug, const QNetworkProxy &proxy)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    QNetworkProxy::ProxyType type = proxy.type();
    switch (type) {
    case QNetworkProxy::NoProxy:
        debug << "NoProxy ";
        break;
    case QNetworkProxy::DefaultProxy:
        debug << "DefaultProxy ";
        break;
    case QNetworkProxy::Socks5Proxy:
        debug << "Socks5Proxy ";
        break;
    case QNetworkProxy::HttpProxy:
        debug << "HttpProxy ";
        break;
    case QNetworkProxy::HttpCachingProxy:
        debug << "HttpCachingProxy ";
        break;
    case QNetworkProxy::FtpCachingProxy:
        debug << "FtpCachingProxy ";
        break;
    default:
        debug << "Unknown proxy " << int(type);
        break;
    }
    debug << '"' << proxy.hostName() << ':' << proxy.port() << "\" ";
    QNetworkProxy::Capabilities caps = proxy.capabilities();
    QStringList scaps;
    if (caps & QNetworkProxy::TunnelingCapability)
        scaps << QStringLiteral("Tunnel");
    if (caps & QNetworkProxy::ListeningCapability)
        scaps << QStringLiteral("Listen");
    if (caps & QNetworkProxy::UdpTunnelingCapability)
        scaps << QStringLiteral("UDP");
    if (caps & QNetworkProxy::CachingCapability)
        scaps << QStringLiteral("Caching");
    if (caps & QNetworkProxy::HostNameLookupCapability)
        scaps << QStringLiteral("NameLookup");
    if (caps & QNetworkProxy::SctpTunnelingCapability)
        scaps << QStringLiteral("SctpTunnel");
    if (caps & QNetworkProxy::SctpListeningCapability)
        scaps << QStringLiteral("SctpListen");
    debug << '[' << scaps.join(u' ') << ']';
    return debug;
}